

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

void __thiscall spv::Module::addFunction(Module *this,Function *fun)

{
  pointer *pppFVar1;
  iterator __position;
  Function *local_8;
  
  __position._M_current =
       (this->functions).super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->functions).super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = fun;
    std::vector<spv::Function*,std::allocator<spv::Function*>>::
    _M_realloc_insert<spv::Function*const&>
              ((vector<spv::Function*,std::allocator<spv::Function*>> *)&this->functions,__position,
               &local_8);
  }
  else {
    *__position._M_current = fun;
    pppFVar1 = &(this->functions).
                super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  return;
}

Assistant:

void addFunction(Function *fun) { functions.push_back(fun); }